

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O3

string * __thiscall
magic_enum::containers::
bitset<Color,magic_enum::containers::detail::indexing<Color,std::less<Color>,void>>::
to_string_abi_cxx11_(string *__return_storage_ptr__,void *this,char_type sep)

{
  Color pos;
  bool bVar1;
  int iVar2;
  size_type __n;
  char *__s;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar3 = 0;
  do {
    pos = *(Color *)((long)&magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>
                    + lVar3);
    bVar1 = bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
            ::test((bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                    *)this,pos);
    if (bVar1) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
                  (__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,1,sep);
      }
      if (pos == RED) {
        iVar2 = 0;
LAB_0014c7bf:
        __n = *(size_type *)
               ((long)&magic_enum::detail::names_v<Color,(magic_enum::detail::enum_subtype)1> +
               (ulong)(uint)(iVar2 << 4));
        __s = *(char **)((long)&PTR_enum_name_v<Color,(Color)1>_0018f020 + (ulong)(uint)(iVar2 << 4)
                        );
      }
      else {
        if (pos == BLUE) {
          iVar2 = 2;
          goto LAB_0014c7bf;
        }
        __s = (char *)0x0;
        __n = 0;
        if (pos == GREEN) {
          iVar2 = 1;
          goto LAB_0014c7bf;
        }
      }
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::append(__return_storage_ptr__,__s,__n);
    }
    lVar3 = lVar3 + 4;
    if (lVar3 == 0xc) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

[[nodiscard]] string to_string(char_type sep = static_cast<char_type>('|')) const {
    string name;

    for (const auto& e : enum_values<E>()) {
      if (test(e)) {
        if (!name.empty()) {
          name.append(1, sep);
        }
        auto n = enum_name(e);
        name.append(n.data(), n.size());
      }
    }
    return name;
  }